

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O0

void addTests_Image_Buffer(UnitTestFramework *framework)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe210;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe218;
  allocator *__lhs;
  string *in_stack_ffffffffffffe240;
  allocator *name;
  testFunction in_stack_ffffffffffffe248;
  allocator *test;
  UnitTestFramework *in_stack_ffffffffffffe250;
  allocator *this;
  allocator local_1a29;
  string local_1a28 [39];
  allocator local_1a01;
  string local_1a00 [39];
  allocator local_19d9;
  string local_19d8 [39];
  allocator local_19b1;
  string local_19b0 [39];
  allocator local_1989;
  string local_1988 [32];
  string local_1968 [32];
  string local_1948 [32];
  string local_1928 [32];
  string local_1908 [39];
  allocator local_18e1;
  string local_18e0 [39];
  allocator local_18b9;
  string local_18b8 [39];
  allocator local_1891;
  string local_1890 [39];
  allocator local_1869;
  string local_1868 [39];
  allocator local_1841;
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [39];
  allocator local_1799;
  string local_1798 [39];
  allocator local_1771;
  string local_1770 [39];
  allocator local_1749;
  string local_1748 [39];
  allocator local_1721;
  string local_1720 [39];
  allocator local_16f9;
  string local_16f8 [32];
  string local_16d8 [32];
  string local_16b8 [32];
  string local_1698 [32];
  string local_1678 [39];
  allocator local_1651;
  string local_1650 [39];
  allocator local_1629;
  string local_1628 [39];
  allocator local_1601;
  string local_1600 [39];
  allocator local_15d9;
  string local_15d8 [39];
  allocator local_15b1;
  string local_15b0 [32];
  string local_1590 [32];
  string local_1570 [32];
  string local_1550 [32];
  string local_1530 [39];
  allocator local_1509;
  string local_1508 [39];
  allocator local_14e1;
  string local_14e0 [39];
  allocator local_14b9;
  string local_14b8 [39];
  allocator local_1491;
  string local_1490 [39];
  allocator local_1469;
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [39];
  allocator local_13c1;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [39];
  allocator local_1371;
  string local_1370 [39];
  allocator local_1349;
  string local_1348 [39];
  allocator local_1321;
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [39];
  allocator local_1279;
  string local_1278 [39];
  allocator local_1251;
  string local_1250 [39];
  allocator local_1229;
  string local_1228 [39];
  allocator local_1201;
  string local_1200 [39];
  allocator local_11d9;
  string local_11d8 [32];
  string local_11b8 [32];
  string local_1198 [32];
  string local_1178 [32];
  string local_1158 [39];
  allocator local_1131;
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [39];
  allocator local_10e1;
  string local_10e0 [39];
  allocator local_10b9;
  string local_10b8 [39];
  allocator local_1091;
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [39];
  allocator local_fe9;
  string local_fe8 [39];
  allocator local_fc1;
  string local_fc0 [39];
  allocator local_f99;
  string local_f98 [39];
  allocator local_f71;
  string local_f70 [39];
  allocator local_f49;
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [39];
  allocator local_ea1;
  string local_ea0 [39];
  allocator local_e79;
  string local_e78 [39];
  allocator local_e51;
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [39];
  allocator local_e01;
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [39];
  allocator local_d59;
  string local_d58 [39];
  allocator local_d31;
  string local_d30 [39];
  allocator local_d09;
  string local_d08 [39];
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [39];
  allocator local_c11;
  string local_c10 [39];
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [39];
  allocator local_b71;
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [39];
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [39];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [39];
  allocator local_909;
  string local_908 [39];
  allocator local_8e1;
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"template_image::EmptyConstructor",&local_29);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"template_image::Constructor",&local_61);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"template_image::NullAssignment",&local_89);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"template_image::",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"CopyConstructor",&local_159);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180," (",&local_181);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"uint8_t",&local_1a9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,")",&local_1d1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"template_image::",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"CopyConstructor",&local_2a1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8," (",&local_2c9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"uint16_t",&local_2f1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,")",&local_319);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"template_image::",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"CopyConstructor",&local_3e9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410," (",&local_411);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"uint32_t",&local_439);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,")",&local_461);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"template_image::",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"CopyConstructor",&local_531);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558," (",&local_559);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"uint64_t",&local_581);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,")",&local_5a9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"template_image::",&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_678,"CopyConstructor",&local_679);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0," (",&local_6a1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"int8_t",&local_6c9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,")",&local_6f1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::__cxx11::string::~string(local_610);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"template_image::",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"CopyConstructor",&local_7c1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8," (",&local_7e9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"int16_t",&local_811);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,")",&local_839);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e0,"template_image::",&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,"CopyConstructor",&local_909);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_930," (",&local_931);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"int32_t",&local_959);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,")",&local_981);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"template_image::",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"CopyConstructor",&local_a51);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78," (",&local_a79);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"int64_t",&local_aa1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,")",&local_ac9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::__cxx11::string::~string(local_9c8);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  std::__cxx11::string::~string(local_a08);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b70,"template_image::",&local_b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b98,"CopyConstructor",&local_b99);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0," (",&local_bc1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"float",&local_be9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c10,")",&local_c11);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_af0);
  std::__cxx11::string::~string(local_c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c11);
  std::__cxx11::string::~string(local_b10);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  std::__cxx11::string::~string(local_b30);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  std::__cxx11::string::~string(local_b50);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  std::__cxx11::string::~string(local_b70);
  std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"template_image::",&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"CopyConstructor",&local_ce1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08," (",&local_d09);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d30,"double",&local_d31);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,")",&local_d59);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::__cxx11::string::~string(local_c78);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::__cxx11::string::~string(local_c98);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e00,"template_image::",&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e28,"AssignmentOperator",&local_e29);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e50," (",&local_e51);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e78,"uint8_t",&local_e79);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea0,")",&local_ea1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_d80);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  std::__cxx11::string::~string(local_dc0);
  std::__cxx11::string::~string(local_e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_e51);
  std::__cxx11::string::~string(local_de0);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_e29);
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f48,"template_image::",&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f70,"AssignmentOperator",&local_f71);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f98," (",&local_f99);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc0,"uint16_t",&local_fc1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe8,")",&local_fe9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_ec8);
  std::__cxx11::string::~string(local_fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
  std::__cxx11::string::~string(local_ee8);
  std::__cxx11::string::~string(local_fc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
  std::__cxx11::string::~string(local_f08);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  std::__cxx11::string::~string(local_f28);
  std::__cxx11::string::~string(local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1090,"template_image::",&local_1091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10b8,"AssignmentOperator",&local_10b9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10e0," (",&local_10e1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1108,"uint32_t",&local_1109);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1130,")",&local_1131);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_1010);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  std::__cxx11::string::~string(local_1030);
  std::__cxx11::string::~string(local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string(local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  std::__cxx11::string::~string(local_1070);
  std::__cxx11::string::~string(local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  std::__cxx11::string::~string(local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11d8,"template_image::",&local_11d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1200,"AssignmentOperator",&local_1201);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1228," (",&local_1229);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1250,"uint64_t",&local_1251);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1278,")",&local_1279);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_1158);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  std::__cxx11::string::~string(local_1178);
  std::__cxx11::string::~string(local_1250);
  std::allocator<char>::~allocator((allocator<char> *)&local_1251);
  std::__cxx11::string::~string(local_1198);
  std::__cxx11::string::~string(local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  std::__cxx11::string::~string(local_11b8);
  std::__cxx11::string::~string(local_1200);
  std::allocator<char>::~allocator((allocator<char> *)&local_1201);
  std::__cxx11::string::~string(local_11d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1320,"template_image::",&local_1321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1348,"AssignmentOperator",&local_1349);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1370," (",&local_1371);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"int8_t",&local_1399);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c0,")",&local_13c1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_12a0);
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::__cxx11::string::~string(local_12c0);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  std::__cxx11::string::~string(local_12e0);
  std::__cxx11::string::~string(local_1370);
  std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  std::__cxx11::string::~string(local_1300);
  std::__cxx11::string::~string(local_1348);
  std::allocator<char>::~allocator((allocator<char> *)&local_1349);
  std::__cxx11::string::~string(local_1320);
  std::allocator<char>::~allocator((allocator<char> *)&local_1321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1468,"template_image::",&local_1469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1490,"AssignmentOperator",&local_1491);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14b8," (",&local_14b9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e0,"int16_t",&local_14e1);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1508,")",&local_1509);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_13e8);
  std::__cxx11::string::~string(local_1508);
  std::allocator<char>::~allocator((allocator<char> *)&local_1509);
  std::__cxx11::string::~string(local_1408);
  std::__cxx11::string::~string(local_14e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e1);
  std::__cxx11::string::~string(local_1428);
  std::__cxx11::string::~string(local_14b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
  std::__cxx11::string::~string(local_1448);
  std::__cxx11::string::~string(local_1490);
  std::allocator<char>::~allocator((allocator<char> *)&local_1491);
  std::__cxx11::string::~string(local_1468);
  std::allocator<char>::~allocator((allocator<char> *)&local_1469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15b0,"template_image::",&local_15b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15d8,"AssignmentOperator",&local_15d9);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1600," (",&local_1601);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1628,"int32_t",&local_1629);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1650,")",&local_1651);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add
            (in_stack_ffffffffffffe250,in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1650);
  std::allocator<char>::~allocator((allocator<char> *)&local_1651);
  std::__cxx11::string::~string(local_1550);
  std::__cxx11::string::~string(local_1628);
  std::allocator<char>::~allocator((allocator<char> *)&local_1629);
  std::__cxx11::string::~string(local_1570);
  std::__cxx11::string::~string(local_1600);
  std::allocator<char>::~allocator((allocator<char> *)&local_1601);
  std::__cxx11::string::~string(local_1590);
  std::__cxx11::string::~string(local_15d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15d9);
  std::__cxx11::string::~string(local_15b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16f8,"template_image::",&local_16f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1720,"AssignmentOperator",&local_1721);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  this = &local_1749;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1748," (",this);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  test = &local_1771;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1770,"int64_t",test);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  name = &local_1799;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1798,")",name);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  UnitTestFramework::add((UnitTestFramework *)this,(testFunction)test,(string *)name);
  std::__cxx11::string::~string(local_1678);
  std::__cxx11::string::~string(local_1798);
  std::allocator<char>::~allocator((allocator<char> *)&local_1799);
  std::__cxx11::string::~string(local_1698);
  std::__cxx11::string::~string(local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  std::__cxx11::string::~string(local_16b8);
  std::__cxx11::string::~string(local_1748);
  std::allocator<char>::~allocator((allocator<char> *)&local_1749);
  std::__cxx11::string::~string(local_16d8);
  std::__cxx11::string::~string(local_1720);
  std::allocator<char>::~allocator((allocator<char> *)&local_1721);
  std::__cxx11::string::~string(local_16f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1840,"template_image::",&local_1841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1868,"AssignmentOperator",&local_1869);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1890," (",&local_1891);
  std::operator+(in_stack_ffffffffffffe218,in_stack_ffffffffffffe210);
  __lhs = &local_18b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18b8,"float",__lhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 in_stack_ffffffffffffe210);
  __rhs = &local_18e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18e0,")",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  UnitTestFramework::add((UnitTestFramework *)this,(testFunction)test,(string *)name);
  std::__cxx11::string::~string(local_17c0);
  std::__cxx11::string::~string(local_18e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18e1);
  std::__cxx11::string::~string(local_17e0);
  std::__cxx11::string::~string(local_18b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18b9);
  std::__cxx11::string::~string(local_1800);
  std::__cxx11::string::~string(local_1890);
  std::allocator<char>::~allocator((allocator<char> *)&local_1891);
  std::__cxx11::string::~string(local_1820);
  std::__cxx11::string::~string(local_1868);
  std::allocator<char>::~allocator((allocator<char> *)&local_1869);
  std::__cxx11::string::~string(local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1988,"template_image::",&local_1989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19b0,"AssignmentOperator",&local_19b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19d8," (",&local_19d9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a00,"double",&local_1a01);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a28,")",&local_1a29);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  UnitTestFramework::add((UnitTestFramework *)this,(testFunction)test,(string *)name);
  std::__cxx11::string::~string(local_1908);
  std::__cxx11::string::~string(local_1a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a29);
  std::__cxx11::string::~string(local_1928);
  std::__cxx11::string::~string(local_1a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a01);
  std::__cxx11::string::~string(local_1948);
  std::__cxx11::string::~string(local_19d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19d9);
  std::__cxx11::string::~string(local_1968);
  std::__cxx11::string::~string(local_19b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b1);
  std::__cxx11::string::~string(local_1988);
  std::allocator<char>::~allocator((allocator<char> *)&local_1989);
  return;
}

Assistant:

void addTests_Image_Buffer( UnitTestFramework & framework )
{
    ADD_TEST( framework, template_image::EmptyConstructor );
    ADD_TEST( framework, template_image::Constructor );
    ADD_TEST( framework, template_image::NullAssignment );

    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, float );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, double );

    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, float );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, double );
}